

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::score_basename_word_prefix_match
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  char *pcVar1;
  char *pcVar2;
  pointer pCVar3;
  ulong uVar4;
  pointer p_Var5;
  CharCount CVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  pointer pCVar10;
  pointer pCVar11;
  long lVar12;
  char *pcVar13;
  CharCount CVar14;
  char *pcVar15;
  long lVar16;
  
  pcVar13 = (this->item_basename_)._M_current;
  pcVar9 = (this->qit_basename_)._M_current;
  pCVar10 = (this->props_).
            super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
            ._M_impl.super__Vector_impl_data._M_start +
            ((long)pcVar13 -
            (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  pcVar1 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var5 = (this->qit_basename_words_).
           super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CVar14 = this->basename_longest_submatch_;
  CVar6 = this->basename_word_gaps_;
  do {
    lVar12 = 0;
LAB_00110761:
    do {
      pcVar2 = p_Var5[1]._M_current;
      p_Var5 = p_Var5 + 1;
      bVar8 = false;
      do {
        pcVar15 = pcVar9;
        pcVar7 = pcVar13;
        lVar16 = 0;
        pCVar11 = pCVar10;
        while( true ) {
          pCVar10 = pCVar11 + 1;
          pcVar9 = pcVar15 + lVar16;
          if ((pcVar9 == pcVar2) || (pcVar7[lVar16] != *pcVar9)) break;
          if (pcVar15 + lVar16 + 1 == pcVar1) {
            uVar4 = lVar12 + lVar16 + 1;
            if (uVar4 < CVar14) {
              uVar4 = CVar14;
            }
            this->basename_longest_submatch_ = uVar4;
            this->unmatched_suffix_len_ =
                 (CharCount)
                 ((this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + (~(ulong)pcVar7 - lVar16));
            return;
          }
          lVar16 = lVar16 + 1;
          bVar8 = true;
          pCVar3 = pCVar11 + 1;
          pCVar11 = pCVar10;
          if (pCVar3->word_start != false) {
            pcVar9 = pcVar15 + lVar16;
            lVar12 = lVar12 + lVar16;
            pcVar13 = pcVar7 + lVar16;
            goto LAB_00110761;
          }
        }
        uVar4 = lVar12 + lVar16;
        if ((ulong)(lVar12 + lVar16) < CVar14) {
          uVar4 = CVar14;
        }
        CVar14 = uVar4;
        this->basename_longest_submatch_ = CVar14;
        lVar12 = 0;
        pcVar13 = pcVar7 + lVar16 + 1;
      } while (pCVar11[1].word_start == false);
      pcVar9 = pcVar15 + lVar16;
      pcVar13 = pcVar7 + lVar16 + 1;
      lVar12 = 0;
    } while (bVar8);
    CVar6 = CVar6 + 1;
    this->basename_word_gaps_ = CVar6;
  } while( true );
}

Assistant:

void score_basename_word_prefix_match() {
    auto item_it = item_basename_;
    auto props_it = props_.cbegin() + (item_basename_ - item_.cbegin());
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    // +1 because the first iteration of the loop skips the word start at the
    // beginning of the basename.
    auto qit_words_it = qit_basename_words_.cbegin() + 1;
    auto query_word_last = *qit_words_it;

    CharCount current_submatch = 0;
    bool any_word_matches = false;

    while (true) {
      if (query_it != query_word_last && *item_it == *query_it) {
        ++query_it;
        current_submatch++;
        any_word_matches = true;
        if (query_it == query_last) {
          break;
        }
      } else {
        basename_longest_submatch_ =
            std::max(basename_longest_submatch_, current_submatch);
        current_submatch = 0;
      }
      ++item_it;
      // At this point we know that the basename *is* a word prefix match, so
      // fully consuming the end of the query should be the only possible way
      // to leave this loop. Hence we skip the comparison to `item_.cend()`.
      // (The same applies to `qit_words_it` and `qit_basename_words_.cend()`
      // below.)
      ++props_it;
      if (props_it->word_start) {
        if (!any_word_matches) {
          basename_word_gaps_++;
        }
        any_word_matches = false;
        ++qit_words_it;
        query_word_last = *qit_words_it;
      }
    }
    basename_longest_submatch_ =
        std::max(basename_longest_submatch_, current_submatch);
    // -1 here because we broke out upon reaching the last match (`query_it ==
    // query_last`) before incrementing `item_it`.
    unmatched_suffix_len_ = item_.cend() - item_it - 1;
  }